

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O1

void * duckdb_je_hpdata_reserve_alloc(hpdata_t *hpdata,size_t sz)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  fb_group_t fVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  uVar15 = sz >> 0xc;
  uVar11 = 0;
  uVar7 = 0;
  uVar9 = 0;
  uVar4 = 0;
  do {
    uVar14 = uVar4;
    uVar4 = uVar9 >> 6;
    uVar9 = (~hpdata->active_pages[uVar4] >> ((byte)uVar9 & 0x3f)) << ((byte)uVar9 & 0x3f);
    if (uVar9 == 0) {
      do {
        if (uVar4 == 7) {
          uVar5 = 0x200;
          goto LAB_01c85a45;
        }
        lVar8 = uVar4 + 1;
        uVar4 = uVar4 + 1;
      } while (hpdata->active_pages[lVar8] == 0xffffffffffffffff);
      uVar9 = ~hpdata->active_pages[lVar8];
    }
    uVar5 = 0;
    if (uVar9 != 0) {
      for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    uVar5 = uVar4 << 6 | uVar5;
    if (0x1ff < uVar5) {
      uVar5 = 0x200;
    }
LAB_01c85a45:
    if (uVar5 != 0x200) {
      uVar9 = uVar5 >> 6;
      fVar10 = (hpdata->active_pages[uVar9] >> ((byte)uVar5 & 0x3f)) << ((byte)uVar5 & 0x3f);
      while (fVar10 == 0) {
        if (uVar9 == 7) {
          uVar7 = 0x200;
          goto LAB_01c85a82;
        }
        lVar8 = uVar9 + 1;
        uVar9 = uVar9 + 1;
        fVar10 = hpdata->active_pages[lVar8];
      }
      uVar7 = 0;
      if (fVar10 != 0) {
        for (; (fVar10 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      uVar7 = uVar9 << 6 | uVar7;
LAB_01c85a82:
      uVar7 = uVar7 - uVar5;
      uVar11 = uVar5;
    }
    uVar4 = uVar14;
    if (uVar14 < uVar7) {
      uVar4 = uVar7;
    }
    uVar9 = uVar11 + uVar7;
  } while (uVar7 < uVar15);
  uVar5 = uVar11 >> 6;
  uVar2 = (uint)uVar11 & 0x3f;
  uVar9 = uVar2 + uVar15;
  uVar4 = 0x40 - (ulong)uVar2;
  if (uVar9 < 0x41) {
    uVar4 = uVar15;
  }
  uVar13 = uVar15 - uVar4;
  uVar6 = (0xffffffffffffffffU >> (-(char)uVar4 & 0x3fU)) << (sbyte)uVar2;
  hpdata->active_pages[uVar5] = hpdata->active_pages[uVar5] | uVar6;
  lVar8 = uVar5 + 1;
  lVar3 = lVar8;
  uVar4 = uVar13;
  if (0x40 < uVar13) {
    uVar4 = 0x40;
    if (uVar9 < 0x40) {
      uVar4 = uVar9;
    }
    uVar16 = (uVar9 - uVar4) - 0x41;
    switchD_0105b559::default
              (hpdata->active_pages + uVar5 + 1,0xff,(uVar16 >> 3 & 0x1ffffffffffffff8) + 8);
    uVar4 = (uVar9 - ((uVar16 & 0xffffffffffffffc0) + uVar4)) - 0x40;
    lVar3 = (uVar16 >> 6) + uVar5 + 2;
  }
  if (uVar4 != 0) {
    hpdata->active_pages[lVar3] =
         hpdata->active_pages[lVar3] | 0xffffffffffffffffU >> (-(char)uVar4 & 0x3fU);
  }
  hpdata->h_nactive = hpdata->h_nactive + uVar15;
  uVar4 = hpdata->touched_pages[uVar5] & uVar6;
  uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar17 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
  uVar4 = uVar13;
  uVar16 = uVar5;
  if (uVar13 < 0x41) {
    lVar3 = uVar5 + 1;
  }
  else {
    do {
      uVar12 = uVar16;
      uVar16 = hpdata->touched_pages[uVar12 + 1] -
               (hpdata->touched_pages[uVar12 + 1] >> 1 & 0x5555555555555555);
      uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
      uVar17 = uVar17 + (((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar4 = uVar4 - 0x40;
      uVar16 = uVar12 + 1;
    } while (0x40 < uVar4);
    lVar3 = uVar12 + 2;
  }
  if (uVar4 != 0) {
    uVar4 = (hpdata->touched_pages[lVar3] << (-(char)uVar4 & 0x3fU)) >> (-(char)uVar4 & 0x3fU);
    uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
    uVar17 = uVar17 + (((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  hpdata->touched_pages[uVar5] = hpdata->touched_pages[uVar5] | uVar6;
  if (0x40 < uVar13) {
    uVar4 = 0x40;
    if (uVar9 < 0x40) {
      uVar4 = uVar9;
    }
    uVar6 = (uVar9 - uVar4) - 0x41;
    switchD_0105b559::default
              (hpdata->touched_pages + uVar5 + 1,0xff,(uVar6 >> 3 & 0x1ffffffffffffff8) + 8);
    uVar13 = (uVar9 - ((uVar6 & 0xffffffffffffffc0) + uVar4)) - 0x40;
    lVar8 = uVar5 + (uVar6 >> 6) + 2;
  }
  if (uVar13 != 0) {
    hpdata->touched_pages[lVar8] =
         hpdata->touched_pages[lVar8] | 0xffffffffffffffffU >> (-(char)uVar13 & 0x3fU);
  }
  hpdata->h_ntouched = hpdata->h_ntouched + (uVar15 - uVar17);
  if (uVar7 == hpdata->h_longest_free_range) {
    uVar15 = uVar15 + uVar11;
    uVar9 = uVar11;
    do {
      if (0x1ff < uVar15) break;
      uVar5 = uVar15 >> 6;
      uVar4 = (~hpdata->active_pages[uVar5] >> ((byte)uVar15 & 0x3f)) << ((byte)uVar15 & 0x3f);
      if (uVar4 == 0) {
        do {
          if (uVar5 == 7) {
            uVar6 = 0x200;
            goto LAB_01c85e1b;
          }
          lVar8 = uVar5 + 1;
          uVar5 = uVar5 + 1;
        } while (hpdata->active_pages[lVar8] == 0xffffffffffffffff);
        uVar4 = ~hpdata->active_pages[lVar8];
      }
      uVar6 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar6 = uVar5 << 6 | uVar6;
      if (0x1ff < uVar6) {
        uVar6 = 0x200;
      }
LAB_01c85e1b:
      if (uVar6 != 0x200) {
        uVar9 = uVar6 >> 6;
        fVar10 = (hpdata->active_pages[uVar9] >> ((byte)uVar6 & 0x3f)) << ((byte)uVar6 & 0x3f);
        while (fVar10 == 0) {
          if (uVar9 == 7) {
            uVar7 = 0x200;
            goto LAB_01c85e59;
          }
          lVar8 = uVar9 + 1;
          uVar9 = uVar9 + 1;
          fVar10 = hpdata->active_pages[lVar8];
        }
        uVar7 = 0;
        if (fVar10 != 0) {
          for (; (fVar10 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar7 = uVar9 << 6 | uVar7;
LAB_01c85e59:
        uVar7 = uVar7 - uVar6;
        uVar9 = uVar6;
      }
      if (uVar6 == 0x200) {
        bVar1 = false;
      }
      else if (uVar7 == hpdata->h_longest_free_range) {
        bVar1 = false;
        uVar14 = uVar7;
      }
      else {
        if (uVar14 < uVar7) {
          uVar14 = uVar7;
        }
        uVar15 = uVar9 + uVar7;
        bVar1 = true;
      }
    } while (bVar1);
    hpdata->h_longest_free_range = uVar14;
  }
  return (void *)(uVar11 * 0x1000 + (long)hpdata->h_address);
}

Assistant:

void *
hpdata_reserve_alloc(hpdata_t *hpdata, size_t sz) {
	hpdata_assert_consistent(hpdata);
	/*
	 * This is a metadata change; the hpdata should therefore either not be
	 * in the psset, or should have explicitly marked itself as being
	 * mid-update.
	 */
	assert(!hpdata->h_in_psset || hpdata->h_updating);
	assert(hpdata->h_alloc_allowed);
	assert((sz & PAGE_MASK) == 0);
	size_t npages = sz >> LG_PAGE;
	assert(npages <= hpdata_longest_free_range_get(hpdata));

	size_t result;

	size_t start = 0;
	/*
	 * These are dead stores, but the compiler will issue warnings on them
	 * since it can't tell statically that found is always true below.
	 */
	size_t begin = 0;
	size_t len = 0;

	size_t largest_unchosen_range = 0;
	while (true) {
		bool found = fb_urange_iter(hpdata->active_pages,
		    HUGEPAGE_PAGES, start, &begin, &len);
		/*
		 * A precondition to this function is that hpdata must be able
		 * to serve the allocation.
		 */
		assert(found);
		assert(len <= hpdata_longest_free_range_get(hpdata));
		if (len >= npages) {
			/*
			 * We use first-fit within the page slabs; this gives
			 * bounded worst-case fragmentation within a slab.  It's
			 * not necessarily right; we could experiment with
			 * various other options.
			 */
			break;
		}
		if (len > largest_unchosen_range) {
			largest_unchosen_range = len;
		}
		start = begin + len;
	}
	/* We found a range; remember it. */
	result = begin;
	fb_set_range(hpdata->active_pages, HUGEPAGE_PAGES, begin, npages);
	hpdata->h_nactive += npages;

	/*
	 * We might be about to dirty some memory for the first time; update our
	 * count if so.
	 */
	size_t new_dirty = fb_ucount(hpdata->touched_pages,  HUGEPAGE_PAGES,
	    result, npages);
	fb_set_range(hpdata->touched_pages, HUGEPAGE_PAGES, result, npages);
	hpdata->h_ntouched += new_dirty;

	/*
	 * If we allocated out of a range that was the longest in the hpdata, it
	 * might be the only one of that size and we'll have to adjust the
	 * metadata.
	 */
	if (len == hpdata_longest_free_range_get(hpdata)) {
		start = begin + npages;
		while (start < HUGEPAGE_PAGES) {
			bool found = fb_urange_iter(hpdata->active_pages,
			    HUGEPAGE_PAGES, start, &begin, &len);
			if (!found) {
				break;
			}
			assert(len <= hpdata_longest_free_range_get(hpdata));
			if (len == hpdata_longest_free_range_get(hpdata)) {
				largest_unchosen_range = len;
				break;
			}
			if (len > largest_unchosen_range) {
				largest_unchosen_range = len;
			}
			start = begin + len;
		}
		hpdata_longest_free_range_set(hpdata, largest_unchosen_range);
	}

	hpdata_assert_consistent(hpdata);
	return (void *)(
	    (byte_t *)hpdata_addr_get(hpdata) + (result << LG_PAGE));
}